

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_stream_destroy(cubeb_stream_conflict *stm)

{
  cubeb_log_level cVar1;
  pa_mainloop_api *ppVar2;
  cubeb_log_callback p_Var3;
  long *in_RDI;
  
  stream_cork(stm,(cork_state)((ulong)in_RDI >> 0x20));
  (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  if (in_RDI[2] != 0) {
    if (in_RDI[6] != 0) {
      ppVar2 = (*cubeb_pa_threaded_mainloop_get_api)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
      (*ppVar2->time_free)((pa_time_event *)in_RDI[6]);
    }
    (*cubeb_pa_stream_set_state_callback)
              ((pa_stream *)in_RDI[2],(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_write_callback)
              ((pa_stream *)in_RDI[2],(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)((pa_stream *)in_RDI[2]);
    (*cubeb_pa_stream_unref)((pa_stream *)in_RDI[2]);
  }
  if (in_RDI[3] != 0) {
    (*cubeb_pa_stream_set_state_callback)
              ((pa_stream *)in_RDI[3],(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_read_callback)
              ((pa_stream *)in_RDI[3],(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)((pa_stream *)in_RDI[3]);
    (*cubeb_pa_stream_unref)((pa_stream *)in_RDI[3]);
  }
  (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
  cVar1 = cubeb_log_get_level();
  if (cVar1 != CUBEB_LOG_DISABLED) {
    p_Var3 = cubeb_log_get_callback();
    if (p_Var3 != (cubeb_log_callback)0x0) {
      cubeb_log_internal("cubeb_pulse.c",0x43a,"Cubeb stream (%p) destroyed successfully.",in_RDI);
    }
  }
  free(in_RDI);
  return;
}

Assistant:

static void
pulse_stream_destroy(cubeb_stream * stm)
{
  stream_cork(stm, CORK);

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  if (stm->output_stream) {

    if (stm->drain_timer) {
      /* there's no pa_rttime_free, so use this instead. */
      WRAP(pa_threaded_mainloop_get_api)
      (stm->context->mainloop)->time_free(stm->drain_timer);
    }

    WRAP(pa_stream_set_state_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_set_write_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->output_stream);
    WRAP(pa_stream_unref)(stm->output_stream);
  }

  if (stm->input_stream) {
    WRAP(pa_stream_set_state_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_set_read_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->input_stream);
    WRAP(pa_stream_unref)(stm->input_stream);
  }
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  LOG("Cubeb stream (%p) destroyed successfully.", stm);
  free(stm);
}